

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BER.h
# Opt level: O2

void __thiscall
OIDType::OIDType(OIDType *this,string *value,
                vector<unsigned_char,_std::allocator<unsigned_char>_> *data,bool valid)

{
  (this->super_BER_CONTAINER)._type = OID;
  (this->super_BER_CONTAINER)._length = 0;
  (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__OIDType_0019b710;
  this->valid = valid;
  std::__cxx11::string::string((string *)&this->_value,(string *)value);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->data,data);
  return;
}

Assistant:

explicit OIDType(const std::string& value, const std::vector<uint8_t>& data, bool valid): BER_CONTAINER(OID), valid(valid), _value(value), data(data) {}